

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

bool __thiscall tinygltf::Buffer::operator==(Buffer *this,Buffer *other)

{
  bool bVar1;
  __type _Var2;
  
  bVar1 = std::operator==(&this->data,&other->data);
  if (bVar1) {
    bVar1 = std::operator==(&(this->extensions)._M_t,&(other->extensions)._M_t);
    if (bVar1) {
      bVar1 = Equals(&this->extras,&other->extras);
      if (bVar1) {
        _Var2 = std::operator==(&this->name,&other->name);
        if (_Var2) {
          _Var2 = std::operator==(&this->uri,&other->uri);
          return _Var2;
        }
      }
    }
  }
  return false;
}

Assistant:

bool Buffer::operator==(const Buffer &other) const {
  return this->data == other.data && this->extensions == other.extensions &&
         this->extras == other.extras && this->name == other.name &&
         this->uri == other.uri;
}